

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_sparse.hpp
# Opt level: O2

true_reference __thiscall
boost::numeric::ublas::
compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
::insert_element(compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 *this,size_type i,const_reference t)

{
  long lVar1;
  long lVar2;
  unsigned_long *__src;
  size_t sVar3;
  true_reference __src_00;
  
  if (*(ulong *)(this + 8) <= *(ulong *)(this + 0x10)) {
    reserve(this,*(ulong *)(this + 8) * 2,true);
  }
  __src = detail::lower_bound<unsigned_long*,unsigned_long,std::less<unsigned_long>>();
  lVar1 = *(long *)(this + 0x10);
  lVar2 = *(long *)(this + 0x28);
  *(long *)(this + 0x10) = lVar1 + 1;
  sVar3 = (lVar2 + lVar1 * 8) - (long)__src;
  if (sVar3 != 0) {
    memmove((void *)((lVar2 + 8 + lVar1 * 8) - sVar3),__src,sVar3);
  }
  *__src = i;
  lVar1 = *(long *)(this + 0x40);
  __src_00 = (true_reference)((long)__src + (lVar1 - lVar2));
  sVar3 = (lVar1 + -8 + *(long *)(this + 0x10) * 8) - (long)__src_00;
  if (sVar3 != 0) {
    memmove((void *)((lVar1 + *(long *)(this + 0x10) * 8) - sVar3),__src_00,sVar3);
  }
  *__src_00 = *t;
  return __src_00;
}

Assistant:

BOOST_UBLAS_INLINE
        true_reference insert_element (size_type i, const_reference t) {
            BOOST_UBLAS_CHECK (!find_element (i), bad_index ());        // duplicate element
            if (filled_ >= capacity_)
                reserve (2 * capacity_, true);
            subiterator_type it (detail::lower_bound (index_data_.begin (), index_data_.begin () + filled_, k_based (i), std::less<size_type> ()));
            // ISSUE max_capacity limit due to difference_type
            typename std::iterator_traits<subiterator_type>::difference_type n = it - index_data_.begin ();
            BOOST_UBLAS_CHECK (filled_ == 0 || filled_ == typename index_array_type::size_type (n) || *it != k_based (i), internal_logic ());   // duplicate found by lower_bound
            ++ filled_;
            it = index_data_.begin () + n;
            std::copy_backward (it, index_data_.begin () + filled_ - 1, index_data_.begin () + filled_);
            *it = k_based (i);
            typename value_array_type::iterator itt (value_data_.begin () + n);
            std::copy_backward (itt, value_data_.begin () + filled_ - 1, value_data_.begin () + filled_);
            *itt = t;
            storage_invariants ();
            return *itt;
        }